

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

uint32 * rw::ps2::instanceUV2(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  ushort uVar1;
  TexCoords *pTVar2;
  TexCoords *pTVar3;
  Geometry *pGVar4;
  uint local_44;
  uint32 i;
  uint32 *d1;
  uint32 *d0;
  uint16 j;
  uint32 n_local;
  uint32 idx_local;
  Mesh *m_local;
  Geometry *g_local;
  uint32 *p_local;
  
  pTVar2 = g->texCoords[0];
  pTVar3 = g->texCoords[1];
  g_local = (Geometry *)p;
  for (local_44 = idx; pGVar4 = g_local, local_44 < idx + n; local_44 = local_44 + 1) {
    uVar1 = m->indices[local_44];
    if (g->numTexCoordSets < 1) {
      (g_local->object).type = '\0';
      (g_local->object).subType = '\0';
      (g_local->object).flags = '\0';
      (g_local->object).privateFlags = '\0';
      *(undefined4 *)&(g_local->object).field_0x4 = 0;
    }
    else {
      *(float32 *)&g_local->object = (&pTVar2->u)[(int)((uint)uVar1 << 1)];
      *(float32 *)&(g_local->object).field_0x4 = (&pTVar2->u)[(int)((uint)uVar1 * 2 + 1)];
    }
    g_local = (Geometry *)&(g_local->object).parent;
    if (g->numTexCoordSets < 2) {
      (g_local->object).type = '\0';
      (g_local->object).subType = '\0';
      (g_local->object).flags = '\0';
      (g_local->object).privateFlags = '\0';
      *(undefined4 *)((long)&(pGVar4->object).parent + 4) = 0;
    }
    else {
      *(float32 *)&g_local->object = (&pTVar3->u)[(int)((uint)uVar1 << 1)];
      *(float32 *)((long)&(pGVar4->object).parent + 4) = (&pTVar3->u)[(int)((uint)uVar1 * 2 + 1)];
    }
    g_local = (Geometry *)&pGVar4->flags;
  }
  for (; ((ulong)g_local & 0xf) != 0; g_local = (Geometry *)&(g_local->object).field_0x4) {
    (g_local->object).type = '\0';
    (g_local->object).subType = '\0';
    (g_local->object).flags = '\0';
    (g_local->object).privateFlags = '\0';
  }
  return (uint32 *)g_local;
}

Assistant:

uint32*
instanceUV2(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d0 = (uint32*)g->texCoords[0];
	uint32 *d1 = (uint32*)g->texCoords[1];
	for(uint32 i = idx; i < idx+n; i++){
		j = m->indices[i];
		if(g->numTexCoordSets > 0){
			*p++ = d0[j*2+0];
			*p++ = d0[j*2+1];
		}else{
			*p++ = 0;
			*p++ = 0;
		}
		if(g->numTexCoordSets > 1){
			*p++ = d1[j*2+0];
			*p++ = d1[j*2+1];
		}else{
			*p++ = 0;
			*p++ = 0;
		}
	}
	while((uintptr)p % 0x10)
		*p++ = 0;
	return p;
}